

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::BooleanBitVectorFunction::checkArguments
          (BooleanBitVectorFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  SystemSubroutine *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  Type *in_R9;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Compilation *comp;
  Expression *in_stack_ffffffffffffffa0;
  ASTContext *in_stack_ffffffffffffffa8;
  undefined7 uVar3;
  undefined1 destination;
  undefined7 uVar4;
  undefined1 isMethod;
  SourceLocation in_stack_fffffffffffffff8;
  
  uVar4 = (undefined7)in_RSI;
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  uVar3 = (undefined7)in_RDX;
  destination = (undefined1)((ulong)in_RDX >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0x134f30f);
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,in_RDI,(bool)isMethod,(Args *)CONCAT17(destination,uVar3),callRange,
                     in_stack_00000010,in_stack_00000018);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               CONCAT17(destination,uVar3),0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x134f394);
    bVar1 = Type::isBitstreamType((Type *)CONCAT17(isMethod,uVar4),(bool)destination);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 CONCAT17(destination,uVar3),0);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x134f3f3)
      ;
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 CONCAT17(destination,uVar3),0);
      sourceRange.startLoc._7_1_ = destination;
      sourceRange.startLoc._0_7_ = uVar3;
      sourceRange.endLoc._0_7_ = uVar4;
      sourceRange.endLoc._7_1_ = isMethod;
      bVar1 = Bitstream::checkClassAccess(in_R9,(ASTContext *)this_00,sourceRange);
      if (bVar1) {
        pTVar2 = Compilation::getBitType(this_00);
      }
      else {
        pTVar2 = Compilation::getErrorType(this_00);
      }
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 CONCAT17(destination,uVar3),0);
      pTVar2 = SystemSubroutine::badArg(in_RCX,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!args[0]->type->isBitstreamType())
            return badArg(context, *args[0]);

        if (!Bitstream::checkClassAccess(*args[0]->type, context, args[0]->sourceRange))
            return comp.getErrorType();

        return comp.getBitType();
    }